

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

int __thiscall PInt::GetLoadOp(PInt *this)

{
  PInt *this_local;
  
  if (*(int *)&this->field_0x24 == 4) {
    this_local._4_4_ = 0xb;
  }
  else if (*(int *)&this->field_0x24 == 1) {
    this_local._4_4_ = 7;
    if ((this->Unsigned & 1U) != 0) {
      this_local._4_4_ = 0xd;
    }
  }
  else {
    if (*(int *)&this->field_0x24 != 2) {
      __assert_fail("0 && \"Unhandled integer size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,1099,"virtual int PInt::GetLoadOp() const");
    }
    this_local._4_4_ = 9;
    if ((this->Unsigned & 1U) != 0) {
      this_local._4_4_ = 0xf;
    }
  }
  return this_local._4_4_;
}

Assistant:

int PInt::GetLoadOp() const
{
	if (Size == 4)
	{
		return OP_LW;
	}
	else if (Size == 1)
	{
		return Unsigned ? OP_LBU : OP_LB;
	}
	else if (Size == 2)
	{
		return Unsigned ? OP_LHU : OP_LH;
	}
	else
	{
		assert(0 && "Unhandled integer size");
		return OP_NOP;
	}
}